

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  long lVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  AssertHelper local_c8;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ChargeType charge;
  MassType mass;
  PositionType position;
  ParticleType particle;
  MomentumType local_48;
  
  position.x = -12.34;
  local_48.x = 3254.23;
  local_48.y = -123.324;
  local_48.z = 123000.0;
  mass = 9.10938215e-28;
  charge = -4.80320427e-10;
  pica::Particle<(pica::Dimension)1>::Particle(&particle,&position,&local_48,1.0,0);
  gtest_ar_1._0_8_ = particle.position.x;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"position[d]","particle.getPosition()[d]",&position.x,
             (double *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_1);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
      pica::Particle<(pica::Dimension)1>::getMomentum(&particle);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar_1,"momentum[d]","particle.getMomentum()[d]",
                 (double *)((long)&local_48.x + lVar1),(double *)(&gtest_ar.success_ + lVar1));
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x4c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        this_00 = &gtest_ar_1.message_;
        goto LAB_0019293e;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
    }
    gtest_ar_1._0_8_ = *(undefined8 *)(pica::ParticleTypes::types + (long)particle.typeIndex * 0x10)
    ;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"mass","particle.getMass()",&mass,(double *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x4d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_1);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_1._0_8_ =
           *(undefined8 *)(pica::ParticleTypes::types + 8 + (long)particle.typeIndex * 0x10);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar,"charge","particle.getCharge()",&charge,(double *)&gtest_ar_1
                );
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        gtest_ar_1.success_ = false;
        gtest_ar_1._1_7_ = 0x3ff00000000000;
        local_c8.data_ = (AssertHelperData *)particle.factor;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"static_cast<FactorType>(1.0)","particle.getFactor()",
                   (double *)&gtest_ar_1,(double *)&local_c8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_1);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                     ,0x4f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper(&local_c8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_1);
        }
        this_00 = &gtest_ar.message_;
        goto LAB_0019293e;
      }
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x4e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_1);
    }
  }
  this_00 = &gtest_ar.message_;
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1);
LAB_0019293e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, ConstructorDefaultFactor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(-12.34, 0.2, 423.12e-2);
    MomentumType momentum(3254.23, -123.324, 1.23e5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    ParticleType particle(position, momentum);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
}